

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall
spvtools::val::Function::RegisterExecutionModelLimitation
          (Function *this,ExecutionModel model,string *message)

{
  pointer pcVar1;
  _func_void *p_Var2;
  long *local_60;
  long local_58;
  long local_50 [2];
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + message->_M_string_length);
  local_40._8_8_ = 0;
  p_Var2 = (_func_void *)operator_new(0x28);
  *(ExecutionModel *)p_Var2 = model;
  *(_func_void **)(p_Var2 + 8) = p_Var2 + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var2 + 8),local_60,local_58 + (long)local_60);
  local_28 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp:376:7)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp:376:7)>
             ::_M_manager;
  local_40._M_unused._M_function_pointer = p_Var2;
  std::__cxx11::
  list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
  ::_M_insert<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>
            ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              *)&this->execution_model_limitations_,(iterator)&this->execution_model_limitations_,
             (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

void Function::RegisterExecutionModelLimitation(spv::ExecutionModel model,
                                                const std::string& message) {
  execution_model_limitations_.push_back(
      [model, message](spv::ExecutionModel in_model, std::string* out_message) {
        if (model != in_model) {
          if (out_message) {
            *out_message = message;
          }
          return false;
        }
        return true;
      });
}